

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall CVmObjTable::restore(CVmObjTable *this,CVmFile *fp,CVmObjFixup **fixups)

{
  int iVar1;
  vm_obj_id_t id_00;
  ulong uVar2;
  void *pvVar3;
  ulong uVar4;
  CVmObjPageEntry *pCVar5;
  undefined8 *in_RDX;
  undefined8 in_RSI;
  CVmObjTable *in_RDI;
  CVmObject *obj;
  uint meta_idx;
  int in_root_set;
  vm_obj_id_t id;
  char buf [2];
  ulong flags;
  vm_obj_id_t new_id;
  vm_obj_id_t old_id;
  ulong cnt;
  int err;
  CVmFile *in_stack_000000c0;
  CVmMetaTable *in_stack_000000c8;
  CVmObject *in_stack_ffffffffffffff98;
  uint in_stack_ffffffffffffffa0;
  int in_stack_ffffffffffffffa4;
  undefined2 in_stack_ffffffffffffffac;
  char in_stack_ffffffffffffffae;
  byte in_stack_ffffffffffffffaf;
  CVmObjTable *in_stack_ffffffffffffffd0;
  int local_4;
  
  *in_RDX = 0;
  local_4 = CVmMetaTable::read_from_file(in_stack_000000c8,in_stack_000000c0);
  if (local_4 == 0) {
    reset_to_image(in_stack_ffffffffffffffd0);
    uVar2 = CVmFile::read_uint4((CVmFile *)in_RDI);
    pvVar3 = operator_new(0x20);
    CVmObjFixup::CVmObjFixup
              ((CVmObjFixup *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (ulong)in_stack_ffffffffffffff98);
    *in_RDX = pvVar3;
    for (; uVar2 != 0; uVar2 = uVar2 - 1) {
      CVmFile::read_uint4((CVmFile *)in_RDI);
      uVar4 = CVmFile::read_uint4((CVmFile *)in_RDI);
      if ((uVar4 & 1) == 0) {
        vm_new_id(0);
      }
      CVmObjFixup::add_fixup
                ((CVmObjFixup *)in_RDI,(vm_obj_id_t)((ulong)pvVar3 >> 0x20),(vm_obj_id_t)pvVar3);
    }
    for (uVar2 = CVmFile::read_uint4((CVmFile *)in_RDI); uVar2 != 0; uVar2 = uVar2 - 1) {
      uVar4 = CVmFile::read_uint4((CVmFile *)in_RDI);
      id_00 = (vm_obj_id_t)uVar4;
      CVmFile::read_bytes((CVmFile *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                          (char *)in_stack_ffffffffffffff98,(size_t)in_RDI);
      in_stack_ffffffffffffffa4 = (int)in_stack_ffffffffffffffae;
      in_stack_ffffffffffffffa0 = (uint)in_stack_ffffffffffffffaf;
      if (in_stack_ffffffffffffffa4 == 0) {
        id_00 = CVmObjFixup::get_new_id
                          ((CVmObjFixup *)
                           CONCAT17(in_stack_ffffffffffffffaf,
                                    CONCAT16(in_stack_ffffffffffffffae,
                                             CONCAT24(in_stack_ffffffffffffffac,id_00))),0);
        CVmMetaTable::create_for_restore
                  ((CVmMetaTable *)in_RDI,(uint)((ulong)pvVar3 >> 0x20),(vm_obj_id_t)pvVar3);
      }
      else {
        iVar1 = is_obj_id_valid((CVmObjTable *)
                                CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                                (vm_obj_id_t)((ulong)in_stack_ffffffffffffff98 >> 0x20));
        if ((iVar1 == 0) ||
           (pCVar5 = get_entry(in_RDI,id_00), (*(ushort *)&pCVar5->field_0x14 & 1) != 0)) {
          return 0x4b6;
        }
      }
      in_stack_ffffffffffffff98 = get_obj(in_RDI,(vm_obj_id_t)((ulong)pvVar3 >> 0x20));
      (*in_stack_ffffffffffffff98->_vptr_CVmObject[0x1e])
                (in_stack_ffffffffffffff98,(ulong)id_00,in_RSI,*in_RDX);
    }
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int CVmObjTable::restore(VMG_ CVmFile *fp, CVmObjFixup **fixups)
{
    int err;
    ulong cnt;

    /* presume we won't create a fixup table */
    *fixups = 0;
    
    /* load the metaclass table */
    if ((err = G_meta_table->read_from_file(fp)) != 0)
        return err;

    /* 
     *   Reset all objects to the initial image file load state.  Note that
     *   we wait until after we've read the metaclass table to reset the
     *   objects, because any intrinsic class objects in the root set will
     *   need to re-initialize their presence in the metaclass table, which
     *   they can't do until after the metaclass table has itself been
     *   reloaded. 
     */
    G_obj_table->reset_to_image(vmg0_);

    /* read the size of the table of contents */
    cnt = fp->read_uint4();

    /* allocate the fixup table */
    *fixups = new CVmObjFixup(cnt);

    /* read the fixup table */
    for ( ; cnt != 0 ; --cnt)
    {
        vm_obj_id_t old_id;
        vm_obj_id_t new_id;
        ulong flags;
        
        /* read the next entry */
        old_id = (vm_obj_id_t)fp->read_uint4();
        flags = fp->read_uint4();
        
        /* 
         *   Allocate a new object ID for this entry.  If the object was
         *   transient, then it won't actually have been saved, so we must
         *   fix up references to the object to nil.  
         */
        if (!(flags & VMOBJ_TOC_TRANSIENT))
            new_id = vm_new_id(vmg_ FALSE);
        else
            new_id = VM_INVALID_OBJ;
        
        /* 
         *   Add the entry.  Note that the table of contents is stored in
         *   ascending order of old ID (i.e., the ID's in the saved state
         *   file's numbering system); this is the same ordering required by
         *   the fixup table, so we can simply read entries from the file
         *   and add them directly to the fixup table.  
         */
        (*fixups)->add_fixup(old_id, new_id);
    }
    
    /* read the number of saved objects */
    cnt = fp->read_uint4();
    
    /* read the objects */
    for ( ; cnt != 0 ; --cnt)
    {
        char buf[2];
        vm_obj_id_t id;
        int in_root_set;
        uint meta_idx;
        CVmObject *obj;
        
        /* read the original object ID */
        id = (vm_obj_id_t)fp->read_uint4();

        /* read the root-set flag and dependency table index */
        fp->read_bytes(buf, 2);
        in_root_set = buf[0];
        meta_idx = (uchar)buf[1];

        /* 
         *   if it's not in the root set, we need to create a new object;
         *   otherwise, the object must already exist, since it came from
         *   the object file 
         */
        if (in_root_set)
        {
            /* 
             *   make sure the object is valid - since it's supposedly in
             *   the root set, it must already exist 
             */
            if (!is_obj_id_valid(id) || get_entry(id)->free_)
                return VMERR_SAVED_OBJ_ID_INVALID;
        }
        else
        {
            /* 
             *   the object was dynamically allocated, so it will have a new
             *   object number - fix up the object ID to the new numbering
             *   system 
             */
            id = (*fixups)->get_new_id(vmg_ id);

            /* create the object */
            G_meta_table->create_for_restore(vmg_ meta_idx, id);
        }

        /* read the object's data */
        obj = get_obj(id);
        obj->restore_from_file(vmg_ id, fp, *fixups);
    }
    
    /* success */
    return 0;
}